

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((iObj < 0) || (uVar1 = (ulong)(uint)iObj, (p->vType).nSize <= iObj)) {
LAB_003bbebd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if (((p->vType).pArray[uVar1] & 0xfeU) != 10) {
    __assert_fail("Bac_ObjIsBoxUser(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0x1e4,"int Bac_NtkDfsUserBoxes_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
  }
  if ((p->vCopy).nSize <= iObj) {
LAB_003bbefb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar5 = (p->vCopy).pArray[uVar1];
  if (uVar5 < 2) {
    return uVar5;
  }
  if (uVar5 == 0xffffffff) {
    Vec_IntSetEntry(&p->vCopy,iObj,0);
    if (iObj != 0) {
      uVar5 = iObj - 1;
      iVar3 = (p->vType).nSize;
      uVar4 = 0;
      do {
        if (iVar3 <= (int)uVar5) goto LAB_003bbebd;
        if (((p->vType).pArray[uVar5] & 0xfeU) != 6) break;
        uVar2 = Bac_BoxFanin(p,iObj,(int)uVar4);
        if (((int)uVar2 < 0) || (iVar3 = (p->vType).nSize, iVar3 <= (int)uVar2)) goto LAB_003bbebd;
        if (((p->vType).pArray[uVar2] & 0xfeU) == 8) {
          __assert_fail("Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
        }
        uVar4 = uVar4 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar1 != uVar4);
    }
    Vec_IntPush(vBoxes,iObj);
    if ((p->vCopy).nSize <= iObj) goto LAB_003bbefb;
    if ((p->vCopy).pArray[uVar1] == -1) {
      Vec_IntSetEntry(&p->vCopy,iObj,1);
      return 1;
    }
  }
  __assert_fail("Bac_ObjCopy(p, i) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
}

Assistant:

int Bac_NtkDfsUserBoxes_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    assert( Bac_ObjIsBoxUser(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) == 1 ) // visited
        return 1;
    if ( Bac_ObjCopy(p, iObj) == 0 ) // loop
        return 0;
    Bac_ObjSetCopy( p, iObj, 0 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        if ( Bac_ObjIsBo(p, iFanin) && Bac_ObjIsBoxUser(p, Bac_ObjFanin(p, iFanin)) )
            if ( !Bac_NtkDfsUserBoxes_rec( p, Bac_ObjFanin(p, iFanin), vBoxes ) )
                return 0;
    Vec_IntPush( vBoxes, iObj );
    Bac_ObjSetCopy( p, iObj, 1 );
    return 1;
}